

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChatBox.h
# Opt level: O0

void __thiscall gui::ChatBox::~ChatBox(ChatBox *this)

{
  Widget *in_RDI;
  vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
  *unaff_retaddr;
  deque<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_> *in_stack_00000040;
  
  (in_RDI->super_Drawable)._vptr_Drawable = (_func_int **)&PTR__ChatBox_0047ef58;
  std::function<void_()>::~function((function<void_()> *)0x236c9d);
  std::
  vector<std::pair<gui::ChatBoxLine,_sf::RectangleShape>,_std::allocator<std::pair<gui::ChatBoxLine,_sf::RectangleShape>_>_>
  ::~vector(unaff_retaddr);
  std::deque<gui::ChatBoxLine,_std::allocator<gui::ChatBoxLine>_>::~deque(in_stack_00000040);
  std::shared_ptr<gui::ChatBoxStyle>::~shared_ptr((shared_ptr<gui::ChatBoxStyle> *)0x236cd0);
  Signal<gui::Widget_*,_const_sf::Vector2<float>_&>::~Signal
            ((Signal<gui::Widget_*,_const_sf::Vector2<float>_&> *)0x236ce1);
  Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>::~Signal
            ((Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&> *)0x236cf2);
  Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&>::~Signal
            ((Signal<gui::Widget_*,_sf::Mouse::Button,_const_sf::Vector2<float>_&> *)0x236d03);
  Widget::~Widget(in_RDI);
  return;
}

Assistant:

virtual ~ChatBox() = default;